

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

int yylex_SKIP_TO_ENDR(void)

{
  LexerState *pLVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  
  pLVar1 = lexerState;
  lexerState->mode = LEXER_NORMAL;
  bVar5 = pLVar1->atLineStart;
  pLVar1->disableMacroArgs = true;
  pLVar1->disableInterpolation = true;
  iVar4 = 1;
  do {
    if ((bVar5 & 1) != 0) {
      while ((uVar2 = peek(), uVar2 == 0x20 || (uVar2 == 9))) {
        shiftChar();
      }
      if (((uVar2 & 0xffffffdf) - 0x41 < 0x1a) || ((uVar2 == 0x5f || (uVar2 == 0x2e)))) {
        shiftChar();
        iVar3 = readIdentifier((char)uVar2);
        bVar5 = 0;
        if (iVar3 < 0x73) {
          if (iVar3 == 0x5d) {
            lexer_IncIFDepth();
          }
          else {
            if (iVar3 != 0x60) goto LAB_0010dae7;
            lexer_DecIFDepth();
          }
        }
        else if (iVar3 - 0x73U < 2) {
          iVar4 = iVar4 + 1;
        }
        else {
          bVar5 = 0;
          if (iVar3 != 0x7b) goto LAB_0010dae7;
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
LAB_0010db52:
            pLVar1 = lexerState;
            pLVar1->disableMacroArgs = false;
            pLVar1->disableInterpolation = false;
            pLVar1->atLineStart = false;
            return 0;
          }
        }
      }
      bVar5 = 0;
    }
LAB_0010dae7:
    do {
      iVar3 = peek();
      if (iVar3 == -1) goto LAB_0010db52;
      shiftChar();
      if ((iVar3 == 10) || (iVar3 == 0xd)) {
        bVar5 = 1;
LAB_0010db1d:
        if (iVar3 != 10) {
          if (iVar3 != 0xd) goto LAB_0010db47;
          iVar3 = peek();
          if (iVar3 == 10) {
            shiftChar();
          }
        }
        pLVar1 = lexerState;
        lexerState->lineNo = lexerState->lineNo + 1;
        pLVar1->colNo = 1;
      }
      else {
        if (iVar3 != 0x5c) goto LAB_0010db1d;
        iVar3 = peek();
        if (iVar3 != -1) {
          shiftChar();
          goto LAB_0010db1d;
        }
      }
LAB_0010db47:
    } while ((bVar5 & 1) == 0);
  } while( true );
}

Assistant:

void lexer_SetMode(enum LexerMode mode)
{
	lexerState->mode = mode;
}